

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void POOL_free(POOL_ctx *ctx)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  long in_RDI;
  void *unaff_retaddr;
  POOL_ctx *in_stack_ffffffffffffffe0;
  undefined8 in_stack_fffffffffffffff0;
  
  if (in_RDI != 0) {
    POOL_join(in_stack_ffffffffffffffe0);
    pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 0x60));
    pthread_cond_destroy((pthread_cond_t *)(in_RDI + 0x88));
    pthread_cond_destroy((pthread_cond_t *)(in_RDI + 0xb8));
    customMem.customFree = (ZSTD_freeFunction)in_RDI;
    customMem.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff0;
    customMem.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)(in_RDI + 8),customMem);
    customMem_00.customFree = (ZSTD_freeFunction)in_RDI;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff0;
    customMem_00.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)(in_RDI + 8),customMem_00);
    customMem_01.customFree = (ZSTD_freeFunction)in_RDI;
    customMem_01.customAlloc = (ZSTD_allocFunction)in_stack_fffffffffffffff0;
    customMem_01.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)(in_RDI + 8),customMem_01);
  }
  return;
}

Assistant:

void POOL_free(POOL_ctx *ctx) {
    if (!ctx) { return; }
    POOL_join(ctx);
    ZSTD_pthread_mutex_destroy(&ctx->queueMutex);
    ZSTD_pthread_cond_destroy(&ctx->queuePushCond);
    ZSTD_pthread_cond_destroy(&ctx->queuePopCond);
    ZSTD_customFree(ctx->queue, ctx->customMem);
    ZSTD_customFree(ctx->threads, ctx->customMem);
    ZSTD_customFree(ctx, ctx->customMem);
}